

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ParseCustomMetaValue(AsciiParser *this)

{
  ostream *poVar1;
  string local_1a8;
  ostringstream local_188 [8];
  ostringstream ss_e;
  AsciiParser *this_local;
  
  ::std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = ::std::operator<<((ostream *)local_188,"[error]");
  poVar1 = ::std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                            );
  poVar1 = ::std::operator<<(poVar1,":");
  poVar1 = ::std::operator<<(poVar1,"ParseCustomMetaValue");
  poVar1 = ::std::operator<<(poVar1,"():");
  poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x93c);
  ::std::operator<<(poVar1," ");
  poVar1 = ::std::operator<<((ostream *)local_188,"TODO");
  ::std::operator<<(poVar1,"\n");
  ::std::__cxx11::ostringstream::str();
  PushError(this,&local_1a8);
  ::std::__cxx11::string::~string((string *)&local_1a8);
  ::std::__cxx11::ostringstream::~ostringstream(local_188);
  return false;
}

Assistant:

bool AsciiParser::ParseCustomMetaValue() {
  // type identifier '=' value

  // return ParseAttributeMeta();
  PUSH_ERROR_AND_RETURN("TODO");
}